

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

bool P_CheckMissileSpawn(AActor *th,double maxdist)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  byte bVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  DVector2 local_c8;
  FCheckPosition local_b8;
  
  if ((((th->flags4).Value & 0x10) != 0) && (0 < th->tics)) {
    uVar3 = FRandom::GenRand32(&pr_checkmissilespawn);
    iVar5 = th->tics - (uVar3 & 3);
    iVar4 = 1;
    if (1 < iVar5) {
      iVar4 = iVar5;
    }
    th->tics = iVar4;
  }
  if (0.0 < maxdist) {
    dVar8 = (th->Vel).X;
    dVar9 = (th->Vel).Y;
    dVar7 = (th->Vel).Z;
    do {
      dVar8 = dVar8 * 0.5;
      dVar9 = dVar9 * 0.5;
      dVar7 = dVar7 * 0.5;
    } while (maxdist * maxdist <= dVar9 * dVar9 + dVar8 * dVar8);
    (th->__Pos).Z = dVar7 + (th->__Pos).Z;
    (th->__Pos).X = dVar8 + (th->__Pos).X;
    (th->__Pos).Y = dVar9 + (th->__Pos).Y;
  }
  bVar1 = *(byte *)((long)&(th->flags2).Value + 1);
  local_b8.LastRipped.NumUsed = 0;
  TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_>::SetNodeVector
            (&local_b8.LastRipped,1);
  local_b8.PushTime = 0;
  local_b8.FromPMove = false;
  bVar6 = 1;
  if (((th->flags).Value & 0x10000) != 0) {
    bVar6 = (*(byte *)((long)&(th->BounceFlags).Value + 1) & 0x10) >> 4;
  }
  local_c8.X = (th->__Pos).X;
  local_c8.Y = (th->__Pos).Y;
  local_b8.DoRipping = (bool)(bVar1 & 1);
  bVar2 = P_TryMove(th,&local_c8,0,(secplane_t *)0x0,&local_b8,true);
  if ((bVar2) ||
     (((th->BlockingMobj != (AActor *)0x0 && (((th->flags2).Value & 0x100) != 0)) &&
      (((th->BlockingMobj->flags5).Value & 0x80000) == 0)))) {
    (th->Prev).Z = (th->__Pos).Z;
    dVar7 = (th->__Pos).Y;
    (th->Prev).X = (th->__Pos).X;
    (th->Prev).Y = dVar7;
    (th->PrevAngles).Roll.Degrees = (th->Angles).Roll.Degrees;
    dVar7 = (th->Angles).Yaw.Degrees;
    (th->PrevAngles).Pitch.Degrees = (th->Angles).Pitch.Degrees;
    (th->PrevAngles).Yaw.Degrees = dVar7;
    if (th->Sector == (sector_t *)0x0) {
      iVar4 = 0;
    }
    else {
      iVar4 = th->Sector->PortalGroup;
    }
    th->PrevPortalGroup = iVar4;
    bVar2 = true;
    goto LAB_00429f73;
  }
  AActor::ClearCounters(th);
  if (th->BlockingLine == (line_t *)0x0) {
LAB_00429f5f:
    bVar2 = false;
    P_ExplodeMissile(th,(line_t_conflict *)0x0,th->BlockingMobj);
  }
  else {
    if (th->BlockingLine->special == 9) {
      (*(th->super_DThinker).super_DObject._vptr_DObject[4])(th);
    }
    else {
      if (bVar6 == 0) goto LAB_00429f5f;
      P_BounceWall(th);
    }
    bVar2 = false;
  }
LAB_00429f73:
  M_Free(local_b8.LastRipped.Nodes);
  return bVar2;
}

Assistant:

bool P_CheckMissileSpawn (AActor* th, double maxdist)
{
	// [RH] Don't decrement tics if they are already less than 1
	if ((th->flags4 & MF4_RANDOMIZE) && th->tics > 0)
	{
		th->tics -= pr_checkmissilespawn() & 3;
		if (th->tics < 1)
			th->tics = 1;
	}

	if (maxdist > 0)
	{
		// move a little forward so an angle can be computed if it immediately explodes
		DVector3 advance = th->Vel;
		double maxsquared = maxdist*maxdist;

		// Keep halving the advance vector until we get something less than maxdist
		// units away, since we still want to spawn the missile inside the shooter.
		do
		{
			advance *= 0.5f;
		}
		while (advance.XY().LengthSquared() >= maxsquared);
		th->SetXYZ(th->Pos() + advance);
	}

	FCheckPosition tm(!!(th->flags2 & MF2_RIP));

	// killough 8/12/98: for non-missile objects (e.g. grenades)
	// 
	// [GZ] MBF excludes non-missile objects from the P_TryMove test
	// and subsequent potential P_ExplodeMissile call. That is because
	// in MBF, a projectile is not an actor with the MF_MISSILE flag
	// but an actor with either or both the MF_MISSILE and MF_BOUNCES
	// flags, and a grenade is identified by not having MF_MISSILE.
	// Killough wanted grenades not to explode directly when spawned,
	// therefore they can be fired safely even when humping a wall as
	// they will then just drop on the floor at their shooter's feet.
	//
	// However, ZDoom does allow non-missiles to be shot as well, so
	// Killough's check for non-missiles is inadequate here. So let's
	// replace it by a check for non-missile and MBF bounce type.
	// This should allow MBF behavior where relevant without altering
	// established ZDoom behavior for crazy stuff like a cacodemon cannon.
	bool MBFGrenade = (!(th->flags & MF_MISSILE) || (th->BounceFlags & BOUNCE_MBF));

	// killough 3/15/98: no dropoff (really = don't care for missiles)
	if (!(P_TryMove (th, th->Pos(), false, NULL, tm, true)))
	{
		// [RH] Don't explode ripping missiles that spawn inside something
		if (th->BlockingMobj == NULL || !(th->flags2 & MF2_RIP) || (th->BlockingMobj->flags5 & MF5_DONTRIP))
		{
			// If this is a monster spawned by A_SpawnProjectile subtract it from the counter.
			th->ClearCounters();
			// [RH] Don't explode missiles that spawn on top of horizon lines
			if (th->BlockingLine != NULL && th->BlockingLine->special == Line_Horizon)
			{
				th->Destroy ();
			}
			else if (MBFGrenade && th->BlockingLine != NULL)
			{
				P_BounceWall(th);
			}
			else
			{
				P_ExplodeMissile (th, NULL, th->BlockingMobj);
			}
			return false;
		}
	}
	th->ClearInterpolation();
	return true;
}